

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::WriteXMLResult(cmCTestLaunch *this,cmXMLWriter *xml)

{
  cmsysProcess *cp;
  int iVar1;
  allocator local_39;
  string local_38;
  
  cmXMLWriter::Comment(xml,"Result of command");
  std::__cxx11::string::string((string *)&local_38,"Result",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_38,"StdOut",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DumpFileToXML(this,xml,&this->LogOut);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&local_38,"StdErr",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DumpFileToXML(this,xml,&this->LogErr);
  cmXMLWriter::EndElement(xml);
  std::__cxx11::string::string((string *)&local_38,"ExitCondition",&local_39);
  cmXMLWriter::StartElement(xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cp = this->Process;
  iVar1 = cmsysProcess_GetState(cp);
  switch(iVar1) {
  case 0:
    cmXMLWriter::Content<char[29]>(xml,(char (*) [29])"No process has been executed");
    break;
  case 1:
    cmXMLWriter::Content<char[37]>(xml,(char (*) [37])"Error administrating child process: ");
    local_38._M_dataplus._M_p = cmsysProcess_GetErrorString(cp);
    goto LAB_002cca5b;
  case 2:
    cmXMLWriter::Content<char[24]>(xml,(char (*) [24])"Terminated abnormally: ");
    local_38._M_dataplus._M_p = cmsysProcess_GetExceptionString(cp);
LAB_002cca5b:
    cmXMLWriter::Content<char_const*>(xml,(char **)&local_38);
    break;
  case 3:
    cmXMLWriter::Content<char[31]>(xml,(char (*) [31])"The process is still executing");
    break;
  case 4:
    cmXMLWriter::Content<int>(xml,&this->ExitCode);
    break;
  case 5:
    cmXMLWriter::Content<char[28]>(xml,(char (*) [28])"Killed when timeout expired");
    break;
  case 6:
    cmXMLWriter::Content<char[17]>(xml,(char (*) [17])"Killed by parent");
    break;
  case 7:
    cmXMLWriter::Content<char[9]>(xml,(char (*) [9])"Disowned");
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLResult(cmXMLWriter& xml)
{
  xml.Comment("Result of command");
  xml.StartElement("Result");

  // StdOut
  xml.StartElement("StdOut");
  this->DumpFileToXML(xml, this->LogOut);
  xml.EndElement(); // StdOut

  // StdErr
  xml.StartElement("StdErr");
  this->DumpFileToXML(xml, this->LogErr);
  xml.EndElement(); // StdErr

  // ExitCondition
  xml.StartElement("ExitCondition");
  cmsysProcess* cp = this->Process;
  switch (cmsysProcess_GetState(cp))
    {
    case cmsysProcess_State_Starting:
      xml.Content("No process has been executed"); break;
    case cmsysProcess_State_Executing:
      xml.Content("The process is still executing"); break;
    case cmsysProcess_State_Disowned:
      xml.Content("Disowned"); break;
    case cmsysProcess_State_Killed:
      xml.Content("Killed by parent"); break;

    case cmsysProcess_State_Expired:
      xml.Content("Killed when timeout expired"); break;
    case cmsysProcess_State_Exited:
      xml.Content(this->ExitCode); break;
    case cmsysProcess_State_Exception:
      xml.Content("Terminated abnormally: ");
      xml.Content(cmsysProcess_GetExceptionString(cp)); break;
    case cmsysProcess_State_Error:
      xml.Content("Error administrating child process: ");
      xml.Content(cmsysProcess_GetErrorString(cp)); break;
    };
  xml.EndElement(); // ExitCondition

  xml.EndElement(); // Result
}